

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

char * __thiscall TiXmlElement::Attribute(TiXmlElement *this,char *name,int *i)

{
  TiXmlAttribute *this_00;
  char *local_30;
  char *result;
  TiXmlAttribute *attrib;
  int *i_local;
  char *name_local;
  TiXmlElement *this_local;
  
  this_00 = TiXmlAttributeSet::Find(&this->attributeSet,name);
  local_30 = (char *)0x0;
  if ((this_00 != (TiXmlAttribute *)0x0) &&
     (local_30 = TiXmlAttribute::Value(this_00), i != (int *)0x0)) {
    TiXmlAttribute::QueryIntValue(this_00,i);
  }
  return local_30;
}

Assistant:

const char* TiXmlElement::Attribute( const char* name, int* i ) const
{
	const TiXmlAttribute* attrib = attributeSet.Find( name );
	const char* result = 0;

	if ( attrib ) {
		result = attrib->Value();
		if ( i ) {
			attrib->QueryIntValue( i );
		}
	}
	return result;
}